

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O0

HMInteger __thiscall hypermind::CompileUnit::CreateLable(CompileUnit *this)

{
  HMUINT32 HVar1;
  uint local_14;
  CompileUnit *local_10;
  CompileUnit *this_local;
  
  local_14 = 0;
  local_10 = this;
  HVar1 = Buffer<unsigned_int>::push(&this->mLables,&this->mVM->mGCHeap,&local_14);
  return HVar1;
}

Assistant:

HMInteger CreateLable() {
            return mLables.push(&mVM->mGCHeap, 0);
        }